

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.cpp
# Opt level: O2

int __thiscall
ncnn::Convolution::forward(Convolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint _c;
  int iVar1;
  size_t _elemsize;
  bool bVar2;
  int iVar3;
  Layer *pLVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int _w;
  int iVar11;
  long lVar12;
  int i_1;
  uint uVar13;
  int iVar14;
  int iVar15;
  size_type __n;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  int q;
  ulong uVar19;
  void *pvVar20;
  int i_2;
  float fVar21;
  long local_6d0;
  Option opt_g;
  Mat weights [4];
  vector<int,_std::allocator<int>_> _space_ofs;
  Mat bottom_blob_unbordered;
  
  if (this->kernel_h == 1 && (this->kernel_w == 1 && bottom_blob->dims == 1)) {
    iVar14 = bottom_blob->w;
    if (iVar14 == this->weight_data_size / this->num_output) {
      pLVar4 = create_layer(0xf);
      ParamDict::ParamDict((ParamDict *)&bottom_blob_unbordered);
      ParamDict::set((ParamDict *)&bottom_blob_unbordered,0,this->num_output);
      ParamDict::set((ParamDict *)&bottom_blob_unbordered,1,this->bias_term);
      ParamDict::set((ParamDict *)&bottom_blob_unbordered,2,this->weight_data_size);
      ParamDict::set((ParamDict *)&bottom_blob_unbordered,8,this->int8_scale_term);
      bottom_blob_unbordered.refcount._0_4_ = (uint)this->use_int8_inference;
      (*pLVar4->_vptr_Layer[2])(pLVar4);
      memset(weights,0,0xe0);
      Mat::operator=(weights,&this->weight_data);
      Mat::operator=(weights + 1,&this->bias_data);
      if (this->int8_scale_term != 0) {
        opt_g._0_8_ = &this->weight_data_int8_scale;
        opt_g.blob_allocator = (Allocator *)0x0;
        opt_g.workspace_allocator = (Allocator *)0x4;
        Mat::operator=(weights + 2,(Mat *)&opt_g);
        Mat::~Mat((Mat *)&opt_g);
        opt_g._0_8_ = &this->bottom_blob_int8_scale;
        opt_g.blob_allocator = (Allocator *)0x0;
        opt_g.workspace_allocator = (Allocator *)0x4;
        Mat::operator=(weights + 3,(Mat *)&opt_g);
        Mat::~Mat((Mat *)&opt_g);
      }
      ModelBinFromMatArray::ModelBinFromMatArray((ModelBinFromMatArray *)&opt_g,weights);
      (*pLVar4->_vptr_Layer[3])(pLVar4,&opt_g);
      (*pLVar4->_vptr_Layer[5])(pLVar4,bottom_blob,top_blob,opt);
      (*pLVar4->_vptr_Layer[1])(pLVar4);
      lVar12 = 0xa8;
      do {
        Mat::~Mat((Mat *)((long)&weights[0].data + lVar12));
        lVar12 = lVar12 + -0x38;
      } while (lVar12 != -0x38);
      ParamDict::~ParamDict((ParamDict *)&bottom_blob_unbordered);
      return 0;
    }
  }
  else {
    iVar14 = bottom_blob->w;
  }
  iVar6 = bottom_blob->h;
  _c = bottom_blob->c;
  uVar5 = (ulong)_c;
  uVar17 = (this->kernel_w + -1) * this->dilation_w;
  _elemsize = bottom_blob->elemsize;
  uVar13 = (this->kernel_h + -1) * this->dilation_h;
  Mat::Mat(&bottom_blob_unbordered,bottom_blob);
  if ((_elemsize != 1 & this->use_int8_inference) == 1) {
    weights[0].dims = 0;
    weights[0].w = 0;
    weights[0].h = 0;
    weights[0].c = 0;
    weights[0].elemsize = 0;
    weights[0].allocator = (Allocator *)0x0;
    weights[0].data = (void *)0x0;
    weights[0].refcount = (int *)0x0;
    weights[0].cstep = 0;
    Mat::create(weights,iVar14,iVar6,_c,1,opt->workspace_allocator);
    iVar11 = -100;
    bVar2 = true;
    if ((weights[0].data != (void *)0x0) && ((long)weights[0].c * weights[0].cstep != 0)) {
      opt_g.lightmode = opt->lightmode;
      opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_g.num_threads = opt->num_threads;
      opt_g.workspace_allocator = opt->workspace_allocator;
      opt_g.blob_allocator = weights[0].allocator;
      (*this->quantize->_vptr_Layer[5])(this->quantize,bottom_blob);
      bVar2 = false;
      Mat::operator=(&bottom_blob_unbordered,weights);
      iVar11 = 0;
    }
    Mat::~Mat(weights);
    if (bVar2) goto LAB_0012a4c3;
  }
  weights[0].refcount =
       (int *)CONCAT44(bottom_blob_unbordered.refcount._4_4_,(uint)bottom_blob_unbordered.refcount);
  weights[0].data = bottom_blob_unbordered.data;
  weights[0].allocator = bottom_blob_unbordered.allocator;
  weights[0].elemsize = bottom_blob_unbordered.elemsize;
  if (weights[0].refcount != (int *)0x0) {
    LOCK();
    *weights[0].refcount = *weights[0].refcount + 1;
    UNLOCK();
  }
  weights[0].w = bottom_blob_unbordered.w;
  weights[0].dims = bottom_blob_unbordered.dims;
  weights[0].h = bottom_blob_unbordered.h;
  weights[0].c = bottom_blob_unbordered.c;
  weights[0].cstep = bottom_blob_unbordered.cstep;
  iVar11 = this->pad_w;
  iVar1 = this->pad_h;
  if (iVar1 < 1 && iVar11 < 1) {
    if (iVar1 == -0xe9 && iVar11 == -0xe9) {
      iVar11 = uVar17 - (iVar14 + -1) % this->stride_w;
      iVar14 = uVar13 - (iVar6 + -1) % this->stride_h;
      if ((0 < iVar11) || (0 < iVar14)) {
        copy_make_border(&bottom_blob_unbordered,weights,iVar14 / 2,iVar14 - iVar14 / 2,iVar11 / 2,
                         iVar11 - iVar11 / 2,0,0.0,opt->workspace_allocator,opt->num_threads);
        goto LAB_00129e5b;
      }
      iVar6 = bottom_blob_unbordered.h;
      iVar14 = bottom_blob_unbordered.w;
    }
LAB_00129ee9:
    iVar1 = (int)(~uVar17 + iVar14) / this->stride_w;
    _w = iVar1 + 1;
    iVar6 = (int)(~uVar13 + iVar6) / this->stride_h;
    Mat::create(top_blob,_w,iVar6 + 1,this->num_output,_elemsize,opt->blob_allocator);
    if (top_blob->data == (void *)0x0) goto LAB_00129fe9;
    iVar11 = -100;
    if ((long)top_blob->c * top_blob->cstep != 0) {
      uVar13 = this->kernel_w * this->kernel_h;
      __n = (size_type)(int)uVar13;
      std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,__n,(allocator_type *)&opt_g);
      iVar11 = this->dilation_h;
      iVar3 = this->kernel_w;
      iVar7 = this->dilation_w * iVar3;
      iVar8 = 0;
      lVar12 = 0;
      for (iVar15 = 0; iVar15 < this->kernel_h; iVar15 = iVar15 + 1) {
        for (lVar16 = 0; (int)lVar16 < iVar3; lVar16 = lVar16 + 1) {
          _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(int)lVar12 + lVar16] = iVar8;
          iVar8 = iVar8 + this->dilation_w;
          iVar3 = this->kernel_w;
        }
        iVar8 = iVar8 + (iVar14 * iVar11 - iVar7);
        lVar12 = (int)lVar12 + lVar16;
      }
      if (this->use_int8_inference == false) {
        uVar10 = 0;
        uVar18 = (ulong)uVar13;
        if ((int)uVar13 < 1) {
          uVar18 = uVar10;
        }
        if ((int)_c < 1) {
          uVar5 = 0;
        }
        for (lVar12 = 0; lVar12 < this->num_output; lVar12 = lVar12 + 1) {
          Mat::channel((Mat *)&opt_g,top_blob,(int)lVar12);
          local_6d0._0_1_ = opt_g.lightmode;
          local_6d0._1_3_ = opt_g._1_3_;
          local_6d0._4_4_ = opt_g.num_threads;
          Mat::~Mat((Mat *)&opt_g);
          for (iVar14 = 0; iVar14 <= iVar6; iVar14 = iVar14 + 1) {
            for (lVar16 = 0; lVar16 <= iVar1; lVar16 = lVar16 + 1) {
              if (this->bias_term == 0) {
                fVar21 = 0.0;
              }
              else {
                fVar21 = *(float *)((long)(this->bias_data).data + lVar12 * 4);
              }
              pvVar20 = (void *)((long)(this->weight_data).data + (long)(int)uVar10 * 4);
              for (uVar19 = 0; uVar19 != uVar5; uVar19 = uVar19 + 1) {
                opt_g._0_8_ = weights[0].cstep * uVar19 * weights[0].elemsize +
                              (long)weights[0].data;
                opt_g.blob_allocator = (Allocator *)0x0;
                opt_g.workspace_allocator = (Allocator *)weights[0].elemsize;
                for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 1) {
                  fVar21 = fVar21 + *(float *)((long)pvVar20 + uVar9 * 4) *
                                    *(float *)(opt_g._0_8_ +
                                              (long)_space_ofs.
                                                    super__Vector_base<int,_std::allocator<int>_>.
                                                    _M_impl.super__Vector_impl_data._M_start[uVar9]
                                              * 4 + (long)this->stride_w * (long)(int)lVar16 * 4 +
                                                    (long)(weights[0].w * iVar14 * this->stride_h) *
                                                    4);
                }
                Mat::~Mat((Mat *)&opt_g);
                pvVar20 = (void *)((long)pvVar20 + __n * 4);
              }
              *(float *)(local_6d0 + lVar16 * 4) = fVar21;
            }
            local_6d0 = local_6d0 + (long)_w * 4;
          }
          uVar10 = (ulong)((int)uVar10 + uVar13 * _c);
        }
      }
      else {
        uVar10 = 0;
        uVar18 = (ulong)uVar13;
        if ((int)uVar13 < 1) {
          uVar18 = uVar10;
        }
        if ((int)_c < 1) {
          uVar5 = uVar10;
        }
        for (; (long)uVar10 < (long)this->num_output; uVar10 = uVar10 + 1) {
          Mat::channel((Mat *)&opt_g,top_blob,(int)uVar10);
          local_6d0._0_1_ = opt_g.lightmode;
          local_6d0._1_3_ = opt_g._1_3_;
          local_6d0._4_4_ = opt_g.num_threads;
          Mat::~Mat((Mat *)&opt_g);
          for (iVar14 = 0; iVar14 <= iVar6; iVar14 = iVar14 + 1) {
            for (lVar12 = 0; lVar12 <= iVar1; lVar12 = lVar12 + 1) {
              lVar16 = (long)(this->weight_data).data + (long)(int)(uVar13 * _c * (int)uVar10);
              iVar11 = 0;
              for (uVar19 = 0; uVar19 != uVar5; uVar19 = uVar19 + 1) {
                opt_g._0_8_ = weights[0].cstep * uVar19 * weights[0].elemsize +
                              (long)weights[0].data;
                opt_g.blob_allocator = (Allocator *)0x0;
                opt_g.workspace_allocator = (Allocator *)weights[0].elemsize;
                for (uVar9 = 0; uVar18 != uVar9; uVar9 = uVar9 + 1) {
                  iVar11 = iVar11 + (int)*(char *)(lVar16 + uVar9) *
                                    (int)*(char *)(opt_g._0_8_ +
                                                  (long)_space_ofs.
                                                                                                                
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar9] +
                                                  (long)this->stride_w * (long)(int)lVar12 +
                                                  (long)(weights[0].w * iVar14 * this->stride_h));
                }
                lVar16 = lVar16 + __n;
                Mat::~Mat((Mat *)&opt_g);
              }
              *(int *)(local_6d0 + lVar12 * 4) = iVar11;
            }
            local_6d0 = local_6d0 + (long)_w * 4;
          }
        }
        opt_g.workspace_allocator = opt->workspace_allocator;
        opt_g.lightmode = opt->lightmode;
        opt_g._1_3_ = *(undefined3 *)&opt->field_0x1;
        opt_g.num_threads = opt->num_threads;
        opt_g.blob_allocator = top_blob->allocator;
        (*this->dequantize->_vptr_Layer[7])();
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
      iVar11 = 0;
    }
  }
  else {
    copy_make_border(&bottom_blob_unbordered,weights,iVar1,iVar1,iVar11,iVar11,0,0.0,
                     opt->workspace_allocator,opt->num_threads);
LAB_00129e5b:
    if ((weights[0].data != (void *)0x0) && ((long)weights[0].c * weights[0].cstep != 0)) {
      iVar14 = weights[0].w;
      iVar6 = weights[0].h;
      goto LAB_00129ee9;
    }
LAB_00129fe9:
    iVar11 = -100;
  }
  Mat::~Mat(weights);
LAB_0012a4c3:
  Mat::~Mat(&bottom_blob_unbordered);
  return iVar11;
}

Assistant:

int Convolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // convolv with NxN kernel
    // value = value + bias

    // flattened blob, implement as InnerProduct
    if (bottom_blob.dims == 1 && kernel_w == 1 && kernel_h == 1)
    {
        int num_input = weight_data_size / num_output;
        if (bottom_blob.w == num_input)
        {
            // call InnerProduct
            ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::InnerProduct);

            // set param
            ncnn::ParamDict pd;
            pd.set(0, num_output);
            pd.set(1, bias_term);
            pd.set(2, weight_data_size);
            pd.set(8, int8_scale_term);

            pd.use_int8_inference = use_int8_inference;

            op->load_param(pd);

            // set weights
            ncnn::Mat weights[4];
            weights[0] = weight_data;
            weights[1] = bias_data;

            if (int8_scale_term)
            {
                weights[2] = Mat(1, (size_t)4u, (void*)&weight_data_int8_scale);
                weights[3] = Mat(1, (size_t)4u, (void*)&bottom_blob_int8_scale);
            }

            op->load_model(ModelBinFromMatArray(weights));

            // forward
            op->forward(bottom_blob, top_blob, opt);

            delete op;

            return 0;
        }
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

//     fprintf(stderr, "Convolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d\n", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_unbordered = bottom_blob;
    if (use_int8_inference && elemsize != 1)
    {
        Mat bottom_blob_int8;
        bottom_blob_int8.create(w, h, channels, (size_t)1u, opt.workspace_allocator);
        if (bottom_blob_int8.empty())
            return -100;

        // quantize, scale and round to nearest
        {
            ncnn::Option opt_g = opt;
            opt_g.blob_allocator = bottom_blob_int8.allocator;

            quantize->forward(bottom_blob, bottom_blob_int8, opt_g);
        }

        bottom_blob_unbordered = bottom_blob_int8;
    }

    Mat bottom_blob_bordered = bottom_blob_unbordered;
    if (pad_w > 0 || pad_h > 0)
    {
        copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, pad_h, pad_h, pad_w, pad_w, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
        if (bottom_blob_bordered.empty())
            return -100;

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }
    else if (pad_w == -233 && pad_h == -233)
    {
        int wpad = kernel_extent_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_extent_h + (h - 1) / stride_h * stride_h - h;
        if (wpad > 0 || hpad > 0)
        {
            copy_make_border(bottom_blob_unbordered, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, BORDER_CONSTANT, 0.f, opt.workspace_allocator, opt.num_threads);
            if (bottom_blob_bordered.empty())
                return -100;
        }

        w = bottom_blob_bordered.w;
        h = bottom_blob_bordered.h;
    }

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    if (use_int8_inference)
    {
        // num_output
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<num_output; p++)
        {
            int* outptr = top_blob.channel(p);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    int sum = 0;

                    const signed char* kptr = (const signed char*)weight_data + maxk * channels * p;

                    // channels
                    for (int q=0; q<channels; q++)
                    {
                        const Mat m = bottom_blob_bordered.channel(q);
                        const signed char* sptr = m.row<signed char>(i*stride_h) + j*stride_w;

                        for (int k = 0; k < maxk; k++)
                        {
                            int val = sptr[ space_ofs[k] ];
                            int w = kptr[k];
                            sum += val * w;
                        }

                        kptr += maxk;
                    }

                    outptr[j] = sum;
                }

                outptr += outw;
            }
        }

        // dequantize, reverse scale inplace
        {
            ncnn::Option opt_g = opt;
            opt_g.blob_allocator = top_blob.allocator;

            dequantize->forward_inplace(top_blob, opt_g);
        }

        return 0;
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p=0; p<num_output; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q=0; q<channels; q++)
                {
                    const Mat m = bottom_blob_bordered.channel(q);
                    const float* sptr = m.row(i*stride_h) + j*stride_w;

                    for (int k = 0; k < maxk; k++) // 29.23
                    {
                        float val = sptr[ space_ofs[k] ]; // 20.72
                        float w = kptr[k];
                        sum += val * w; // 41.45
                    }

                    kptr += maxk;
                }

                outptr[j] = sum;
            }

            outptr += outw;
        }
    }

    return 0;
}